

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Model::clear_Type(Model *this)

{
  uint32_t uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  SupportVectorClassifier *this_00;
  
  uVar1 = this->_oneof_case_[0];
  if ((int)uVar1 < 0x230) {
    if (399 < (int)uVar1) {
      if ((int)uVar1 < 500) {
        switch(uVar1) {
        case 400:
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar2 = (undefined8 *)*puVar2;
          }
          if ((puVar2 != (undefined8 *)0x0) ||
             (this_00 = (SupportVectorClassifier *)(this->Type_).glmclassifier_,
             this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
          GLMClassifier::~GLMClassifier((GLMClassifier *)this_00);
          uVar3 = 0x50;
          break;
        case 0x191:
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar2 = (undefined8 *)*puVar2;
          }
          if ((puVar2 != (undefined8 *)0x0) ||
             (this_00 = (this->Type_).supportvectorclassifier_,
             this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
          SupportVectorClassifier::~SupportVectorClassifier(this_00);
          uVar3 = 0x98;
          break;
        case 0x192:
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar2 = (undefined8 *)*puVar2;
          }
          if ((puVar2 != (undefined8 *)0x0) ||
             (this_00 = (SupportVectorClassifier *)(this->Type_).treeensembleclassifier_,
             this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
          TreeEnsembleClassifier::~TreeEnsembleClassifier((TreeEnsembleClassifier *)this_00);
          goto LAB_00248103;
        case 0x193:
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar2 = (undefined8 *)*puVar2;
          }
          if ((puVar2 != (undefined8 *)0x0) ||
             (this_00 = (SupportVectorClassifier *)(this->Type_).neuralnetworkclassifier_,
             this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
          NeuralNetworkClassifier::~NeuralNetworkClassifier((NeuralNetworkClassifier *)this_00);
          uVar3 = 0x68;
          break;
        case 0x194:
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar2 = (undefined8 *)*puVar2;
          }
          if ((puVar2 != (undefined8 *)0x0) ||
             (this_00 = (SupportVectorClassifier *)(this->Type_).knearestneighborsclassifier_,
             this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
          KNearestNeighborsClassifier::~KNearestNeighborsClassifier
                    ((KNearestNeighborsClassifier *)this_00);
LAB_00247fe1:
          uVar3 = 0x48;
          break;
        default:
          goto switchD_00247935_caseD_25d;
        }
      }
      else {
        if ((int)uVar1 < 0x1f6) {
          if (uVar1 != 500) {
            if (uVar1 != 0x1f5) goto switchD_00247935_caseD_25d;
            uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
            puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
            if ((uVar3 & 1) != 0) {
              puVar2 = (undefined8 *)*puVar2;
            }
            if ((puVar2 != (undefined8 *)0x0) ||
               (this_00 = (SupportVectorClassifier *)(this->Type_).itemsimilarityrecommender_,
               this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
            ItemSimilarityRecommender::~ItemSimilarityRecommender
                      ((ItemSimilarityRecommender *)this_00);
            goto LAB_00247d75;
          }
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar2 = (undefined8 *)*puVar2;
          }
          if ((puVar2 != (undefined8 *)0x0) ||
             (this_00 = (SupportVectorClassifier *)(this->Type_).neuralnetwork_,
             this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
          NeuralNetwork::~NeuralNetwork((NeuralNetwork *)this_00);
        }
        else {
          if (uVar1 == 0x1f6) {
            uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
            puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
            if ((uVar3 & 1) != 0) {
              puVar2 = (undefined8 *)*puVar2;
            }
            if ((puVar2 != (undefined8 *)0x0) ||
               (this_00 = (SupportVectorClassifier *)(this->Type_).mlprogram_,
               this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
            MILSpec::Program::~Program((Program *)this_00);
            uVar3 = 0x88;
            goto LAB_00248212;
          }
          if (uVar1 != 0x22b) {
            if (uVar1 != 0x22c) goto switchD_00247935_caseD_25d;
            uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
            puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
            if ((uVar3 & 1) != 0) {
              puVar2 = (undefined8 *)*puVar2;
            }
            if ((puVar2 != (undefined8 *)0x0) ||
               (this_00 = (SupportVectorClassifier *)(this->Type_).linkedmodel_,
               this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
            LinkedModel::~LinkedModel((LinkedModel *)this_00);
            goto LAB_00248173;
          }
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar2 = (undefined8 *)*puVar2;
          }
          if ((puVar2 != (undefined8 *)0x0) ||
             (this_00 = (SupportVectorClassifier *)(this->Type_).custommodel_,
             this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
          CustomModel::~CustomModel((CustomModel *)this_00);
        }
LAB_002481ab:
        uVar3 = 0x58;
      }
      goto LAB_00248212;
    }
    if ((int)uVar1 < 300) {
      if (uVar1 == 200) {
        uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
        puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          puVar2 = (undefined8 *)*puVar2;
        }
        if ((puVar2 != (undefined8 *)0x0) ||
           (this_00 = (SupportVectorClassifier *)(this->Type_).pipelineclassifier_,
           this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
        PipelineClassifier::~PipelineClassifier((PipelineClassifier *)this_00);
      }
      else {
        if (uVar1 != 0xc9) {
          if (uVar1 != 0xca) goto switchD_00247935_caseD_25d;
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar2 = (undefined8 *)*puVar2;
          }
          if ((puVar2 != (undefined8 *)0x0) ||
             (this_00 = (SupportVectorClassifier *)(this->Type_).pipeline_,
             this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
          Pipeline::~Pipeline((Pipeline *)this_00);
          goto LAB_00247fe1;
        }
        uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
        puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          puVar2 = (undefined8 *)*puVar2;
        }
        if ((puVar2 != (undefined8 *)0x0) ||
           (this_00 = (SupportVectorClassifier *)(this->Type_).pipelineregressor_,
           this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
        PipelineRegressor::~PipelineRegressor((PipelineRegressor *)this_00);
      }
      goto LAB_00248173;
    }
    switch(uVar1) {
    case 300:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).glmregressor_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      GLMRegressor::~GLMRegressor((GLMRegressor *)this_00);
      uVar3 = 0x40;
      break;
    case 0x12d:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).supportvectorregressor_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      SupportVectorRegressor::~SupportVectorRegressor((SupportVectorRegressor *)this_00);
      goto LAB_0024820d;
    case 0x12e:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).treeensembleregressor_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      TreeEnsembleRegressor::~TreeEnsembleRegressor((TreeEnsembleRegressor *)this_00);
      goto LAB_00248173;
    case 0x12f:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).neuralnetworkregressor_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      NeuralNetworkRegressor::~NeuralNetworkRegressor((NeuralNetworkRegressor *)this_00);
      goto LAB_002481ab;
    case 0x130:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).bayesianprobitregressor_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      BayesianProbitRegressor::~BayesianProbitRegressor((BayesianProbitRegressor *)this_00);
      uVar3 = 0x78;
      break;
    default:
      goto switchD_00247935_caseD_25d;
    }
    goto LAB_00248212;
  }
  if (899 < (int)uVar1) {
    switch(uVar1) {
    case 2000:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).textclassifier_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      CoreMLModels::TextClassifier::~TextClassifier((TextClassifier *)this_00);
      goto LAB_0024820d;
    case 0x7d1:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).wordtagger_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      CoreMLModels::WordTagger::~WordTagger((WordTagger *)this_00);
      goto LAB_002481ab;
    case 0x7d2:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).visionfeatureprint_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      CoreMLModels::VisionFeaturePrint::~VisionFeaturePrint((VisionFeaturePrint *)this_00);
      break;
    case 0x7d3:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).soundanalysispreprocessing_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      CoreMLModels::SoundAnalysisPreprocessing::~SoundAnalysisPreprocessing
                ((SoundAnalysisPreprocessing *)this_00);
      break;
    case 0x7d4:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).gazetteer_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      CoreMLModels::Gazetteer::~Gazetteer((Gazetteer *)this_00);
LAB_0024820d:
      uVar3 = 0x38;
      goto LAB_00248212;
    case 0x7d5:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).wordembedding_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      CoreMLModels::WordEmbedding::~WordEmbedding((WordEmbedding *)this_00);
      goto LAB_002480c7;
    case 0x7d6:
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).audiofeatureprint_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      CoreMLModels::AudioFeaturePrint::~AudioFeaturePrint((AudioFeaturePrint *)this_00);
      break;
    default:
      if (uVar1 == 900) {
        uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
        puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          puVar2 = (undefined8 *)*puVar2;
        }
        if ((puVar2 != (undefined8 *)0x0) ||
           (this_00 = (SupportVectorClassifier *)(this->Type_).identity_,
           this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
        Identity::~Identity((Identity *)this_00);
        goto LAB_0024808b;
      }
      if (uVar1 != 3000) goto switchD_00247935_caseD_25d;
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar2 = (undefined8 *)*puVar2;
      }
      if ((puVar2 != (undefined8 *)0x0) ||
         (this_00 = (SupportVectorClassifier *)(this->Type_).serializedmodel_,
         this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
      SerializedModel::~SerializedModel((SerializedModel *)this_00);
      goto LAB_002480c7;
    }
LAB_00248173:
    uVar3 = 0x20;
    goto LAB_00248212;
  }
  switch(uVar1) {
  case 600:
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).onehotencoder_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    OneHotEncoder::~OneHotEncoder((OneHotEncoder *)this_00);
    goto LAB_002480c7;
  case 0x259:
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).imputer_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    Imputer::~Imputer((Imputer *)this_00);
    break;
  case 0x25a:
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).featurevectorizer_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    FeatureVectorizer::~FeatureVectorizer((FeatureVectorizer *)this_00);
    break;
  case 0x25b:
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).dictvectorizer_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    DictVectorizer::~DictVectorizer((DictVectorizer *)this_00);
    goto LAB_00248173;
  case 0x25c:
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).scaler_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    Scaler::~Scaler((Scaler *)this_00);
    goto LAB_0024820d;
  case 0x25d:
  case 0x260:
    goto switchD_00247935_caseD_25d;
  case 0x25e:
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).categoricalmapping_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    CategoricalMapping::~CategoricalMapping((CategoricalMapping *)this_00);
    break;
  case 0x25f:
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).normalizer_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    Normalizer::~Normalizer((Normalizer *)this_00);
LAB_0024808b:
    uVar3 = 0x18;
    goto LAB_00248212;
  case 0x261:
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).arrayfeatureextractor_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    ArrayFeatureExtractor::~ArrayFeatureExtractor((ArrayFeatureExtractor *)this_00);
LAB_002480c7:
    uVar3 = 0x28;
    goto LAB_00248212;
  case 0x262:
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).nonmaximumsuppression_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    NonMaximumSuppression::~NonMaximumSuppression((NonMaximumSuppression *)this_00);
LAB_00247d75:
    uVar3 = 0x70;
    goto LAB_00248212;
  default:
    if (uVar1 != 0x230) goto switchD_00247935_caseD_25d;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 != (undefined8 *)0x0) ||
       (this_00 = (SupportVectorClassifier *)(this->Type_).classconfidencethresholding_,
       this_00 == (SupportVectorClassifier *)0x0)) goto switchD_00247935_caseD_25d;
    ClassConfidenceThresholding::~ClassConfidenceThresholding
              ((ClassConfidenceThresholding *)this_00);
  }
LAB_00248103:
  uVar3 = 0x30;
LAB_00248212:
  operator_delete(this_00,uVar3);
switchD_00247935_caseD_25d:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Model::clear_Type() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Model)
  switch (Type_case()) {
    case kPipelineClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.pipelineclassifier_;
      }
      break;
    }
    case kPipelineRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.pipelineregressor_;
      }
      break;
    }
    case kPipeline: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.pipeline_;
      }
      break;
    }
    case kGlmRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.glmregressor_;
      }
      break;
    }
    case kSupportVectorRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.supportvectorregressor_;
      }
      break;
    }
    case kTreeEnsembleRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.treeensembleregressor_;
      }
      break;
    }
    case kNeuralNetworkRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.neuralnetworkregressor_;
      }
      break;
    }
    case kBayesianProbitRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.bayesianprobitregressor_;
      }
      break;
    }
    case kGlmClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.glmclassifier_;
      }
      break;
    }
    case kSupportVectorClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.supportvectorclassifier_;
      }
      break;
    }
    case kTreeEnsembleClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.treeensembleclassifier_;
      }
      break;
    }
    case kNeuralNetworkClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.neuralnetworkclassifier_;
      }
      break;
    }
    case kKNearestNeighborsClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.knearestneighborsclassifier_;
      }
      break;
    }
    case kNeuralNetwork: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.neuralnetwork_;
      }
      break;
    }
    case kItemSimilarityRecommender: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.itemsimilarityrecommender_;
      }
      break;
    }
    case kMlProgram: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.mlprogram_;
      }
      break;
    }
    case kCustomModel: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.custommodel_;
      }
      break;
    }
    case kLinkedModel: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.linkedmodel_;
      }
      break;
    }
    case kClassConfidenceThresholding: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.classconfidencethresholding_;
      }
      break;
    }
    case kOneHotEncoder: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.onehotencoder_;
      }
      break;
    }
    case kImputer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.imputer_;
      }
      break;
    }
    case kFeatureVectorizer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.featurevectorizer_;
      }
      break;
    }
    case kDictVectorizer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.dictvectorizer_;
      }
      break;
    }
    case kScaler: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.scaler_;
      }
      break;
    }
    case kCategoricalMapping: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.categoricalmapping_;
      }
      break;
    }
    case kNormalizer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.normalizer_;
      }
      break;
    }
    case kArrayFeatureExtractor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.arrayfeatureextractor_;
      }
      break;
    }
    case kNonMaximumSuppression: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.nonmaximumsuppression_;
      }
      break;
    }
    case kIdentity: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.identity_;
      }
      break;
    }
    case kTextClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.textclassifier_;
      }
      break;
    }
    case kWordTagger: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.wordtagger_;
      }
      break;
    }
    case kVisionFeaturePrint: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.visionfeatureprint_;
      }
      break;
    }
    case kSoundAnalysisPreprocessing: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.soundanalysispreprocessing_;
      }
      break;
    }
    case kGazetteer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.gazetteer_;
      }
      break;
    }
    case kWordEmbedding: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.wordembedding_;
      }
      break;
    }
    case kAudioFeaturePrint: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.audiofeatureprint_;
      }
      break;
    }
    case kSerializedModel: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.serializedmodel_;
      }
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = TYPE_NOT_SET;
}